

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  float fVar3;
  ImVec2 IVar4;
  float fVar6;
  ImVec2 IVar5;
  ImVec2 IVar7;
  
  if (cond == 0 || (window->SetWindowPosAllowFlags & cond) != 0) {
    window->SetWindowPosAllowFlags = window->SetWindowPosAllowFlags & 0xfffffff1;
    (window->SetWindowPosVal).x = 3.4028235e+38;
    (window->SetWindowPosVal).y = 3.4028235e+38;
    IVar4.x = (float)(int)(*pos).x;
    IVar4.y = (float)(int)(*pos).y;
    IVar5 = window->Pos;
    IVar1 = (window->DC).CursorPos;
    IVar2 = (window->DC).CursorMaxPos;
    window->Pos = IVar4;
    fVar3 = IVar4.x - IVar5.x;
    fVar6 = IVar4.y - IVar5.y;
    IVar7.x = IVar1.x + fVar3;
    IVar7.y = IVar1.y + fVar6;
    (window->DC).CursorPos = IVar7;
    IVar5.x = fVar3 + IVar2.x;
    IVar5.y = fVar6 + IVar2.y;
    (window->DC).CursorMaxPos = IVar5;
  }
  return;
}

Assistant:

static void SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    window->DC.CursorPos += (window->Pos - old_pos);    // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += (window->Pos - old_pos); // And more importantly we need to adjust this so size calculation doesn't get affected.
}